

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineImageSamplingInstance.cpp
# Opt level: O0

Vec4 __thiscall
vkt::pipeline::anon_unknown_0::swizzleScaleBias
          (anon_unknown_0 *this,Vec4 *vec,VkComponentMapping *swz)

{
  undefined8 extraout_XMM0_Qa;
  ulong uVar1;
  Vec4 VVar2;
  float local_48 [2];
  float channelValues [7];
  VkComponentMapping *swz_local;
  Vec4 *vec_local;
  
  local_48[0] = 1.0;
  local_48[1] = 1.0;
  channelValues[0] = 1.0;
  channelValues[1] = tcu::Vector<float,_4>::x(vec);
  channelValues[2] = tcu::Vector<float,_4>::y(vec);
  channelValues[3] = tcu::Vector<float,_4>::z(vec);
  channelValues[4] = tcu::Vector<float,_4>::w(vec);
  uVar1 = (ulong)(uint)local_48[swz->g];
  tcu::Vector<float,_4>::Vector
            ((Vector<float,_4> *)this,local_48[swz->r],local_48[swz->g],local_48[swz->b],
             local_48[swz->a]);
  VVar2.m_data[2] = (float)(int)uVar1;
  VVar2.m_data[3] = (float)(int)(uVar1 >> 0x20);
  VVar2.m_data[0] = (float)(int)extraout_XMM0_Qa;
  VVar2.m_data[1] = (float)(int)((ulong)extraout_XMM0_Qa >> 0x20);
  return (Vec4)VVar2.m_data;
}

Assistant:

tcu::Vec4 swizzleScaleBias (const tcu::Vec4& vec, const vk::VkComponentMapping& swz)
{
	const float channelValues[] =
	{
		1.0f, // -1
		1.0f, // 0
		1.0f,
		vec.x(),
		vec.y(),
		vec.z(),
		vec.w()
	};

	return tcu::Vec4(channelValues[swz.r], channelValues[swz.g], channelValues[swz.b], channelValues[swz.a]);
}